

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SelectAddColumnTypeAndCollation(Parse *pParse,Table *pTab,Select *pSelect)

{
  char cVar1;
  sqlite3 *db_00;
  sqlite3 *db_01;
  sqlite3 *psVar2;
  Vdbe *pVVar3;
  long *in_RDX;
  long in_RSI;
  long *in_RDI;
  int m;
  int n;
  char *zType;
  ExprList_item *a;
  Expr *p;
  Expr *in_stack_00000028;
  int i;
  CollSeq *pColl;
  Column *pCol;
  NameContext sNC;
  sqlite3 *db;
  Expr *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int local_6c;
  Expr *in_stack_ffffffffffffff98;
  Parse *pParse_00;
  undefined1 local_58 [8];
  long local_50;
  long local_20;
  long *local_18;
  long local_10;
  
  local_20 = *in_RDI;
  if (*(char *)(local_20 + 0x61) == '\0') {
    local_18 = in_RDX;
    local_10 = in_RSI;
    memset(local_58,0,0x38);
    local_50 = local_18[5];
    db_00 = (sqlite3 *)(*local_18 + 8);
    local_6c = 0;
    pParse_00 = *(Parse **)(local_10 + 8);
    for (; local_6c < *(short *)(local_10 + 0x46); local_6c = local_6c + 1) {
      db_01 = (sqlite3 *)columnTypeImpl((NameContext *)pColl,in_stack_00000028);
      cVar1 = sqlite3ExprAffinity(in_stack_ffffffffffffff68);
      *(char *)((long)&pParse_00->rc + 1) = cVar1;
      if (db_01 != (sqlite3 *)0x0) {
        in_stack_ffffffffffffff70 = sqlite3Strlen30((char *)in_stack_ffffffffffffff68);
        in_stack_ffffffffffffff74 = sqlite3Strlen30((char *)in_stack_ffffffffffffff68);
        psVar2 = (sqlite3 *)
                 sqlite3DbReallocOrFree
                           (db_00,db_01,
                            CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        pParse_00->db = psVar2;
        if (pParse_00->db != (sqlite3 *)0x0) {
          memcpy((void *)((long)pParse_00->db->aLimit +
                         (long)(in_stack_ffffffffffffff74 + 1) + -0x7c),db_01,
                 (long)(in_stack_ffffffffffffff70 + 1));
          *(byte *)((long)&pParse_00->rc + 3) = *(byte *)((long)&pParse_00->rc + 3) | 4;
        }
      }
      if (*(char *)((long)&pParse_00->rc + 1) == '\0') {
        *(undefined1 *)((long)&pParse_00->rc + 1) = 0x41;
      }
      in_stack_ffffffffffffff98 = (Expr *)sqlite3ExprCollSeq(pParse_00,in_stack_ffffffffffffff98);
      if ((in_stack_ffffffffffffff98 != (Expr *)0x0) && (pParse_00->pVdbe == (Vdbe *)0x0)) {
        pVVar3 = (Vdbe *)sqlite3DbStrDup(db_01,(char *)CONCAT44(in_stack_ffffffffffffff74,
                                                                in_stack_ffffffffffffff70));
        pParse_00->pVdbe = pVVar3;
      }
      pParse_00 = (Parse *)&pParse_00->isMultiWrite;
    }
    *(undefined2 *)(local_10 + 0x4a) = 1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SelectAddColumnTypeAndCollation(
  Parse *pParse,        /* Parsing contexts */
  Table *pTab,          /* Add column type information to this table */
  Select *pSelect       /* SELECT used to determine types and collations */
){
  sqlite3 *db = pParse->db;
  NameContext sNC;
  Column *pCol;
  CollSeq *pColl;
  int i;
  Expr *p;
  struct ExprList_item *a;

  assert( pSelect!=0 );
  assert( (pSelect->selFlags & SF_Resolved)!=0 );
  assert( pTab->nCol==pSelect->pEList->nExpr || db->mallocFailed );
  if( db->mallocFailed ) return;
  memset(&sNC, 0, sizeof(sNC));
  sNC.pSrcList = pSelect->pSrc;
  a = pSelect->pEList->a;
  for(i=0, pCol=pTab->aCol; i<pTab->nCol; i++, pCol++){
    const char *zType;
    int n, m;
    p = a[i].pExpr;
    zType = columnType(&sNC, p, 0, 0, 0);
    /* pCol->szEst = ... // Column size est for SELECT tables never used */
    pCol->affinity = sqlite3ExprAffinity(p);
    if( zType ){
      m = sqlite3Strlen30(zType);
      n = sqlite3Strlen30(pCol->zName);
      pCol->zName = sqlite3DbReallocOrFree(db, pCol->zName, n+m+2);
      if( pCol->zName ){
        memcpy(&pCol->zName[n+1], zType, m+1);
        pCol->colFlags |= COLFLAG_HASTYPE;
      }
    }
    if( pCol->affinity==0 ) pCol->affinity = SQLITE_AFF_BLOB;
    pColl = sqlite3ExprCollSeq(pParse, p);
    if( pColl && pCol->zColl==0 ){
      pCol->zColl = sqlite3DbStrDup(db, pColl->zName);
    }
  }
  pTab->szTabRow = 1; /* Any non-zero value works */
}